

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Calls.cpp
# Opt level: O2

PSNodesSeq * __thiscall
dg::pta::LLVMPointerGraphBuilder::createRealloc
          (PSNodesSeq *__return_storage_ptr__,LLVMPointerGraphBuilder *this,CallInst *CInst)

{
  PSNodeAlloc *pPVar1;
  PSNode *n;
  PSNode *n_00;
  uint64_t uVar2;
  PSNodeAlloc *reall;
  PSNode *orig_mem;
  int local_44;
  PSNodeAlloc *local_40;
  PSNode *local_38;
  
  (__return_storage_ptr__->_nodes).
  super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __return_storage_ptr__->_repr = (PSNode *)0x0;
  (__return_storage_ptr__->_nodes).
  super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->_nodes).
  super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38 = getOperand(this,*(Value **)(CInst + -(ulong)(uint)(*(int *)(CInst + 0x14) << 5)));
  pPVar1 = (PSNodeAlloc *)PointerGraph::create<(dg::pta::PSNodeType)1>((PointerGraph *)this);
  local_40 = (PSNodeAlloc *)0x0;
  if ((pPVar1->super_PSNode).type == ALLOC) {
    local_40 = pPVar1;
  }
  local_40->is_heap = true;
  (local_40->super_PSNode).super_SubgraphNode<dg::pta::PSNode>.user_data = CInst;
  n = PointerGraph::
      create<(dg::pta::PSNodeType)20,dg::pta::PSNode*&,dg::pta::PSNodeAlloc*&,unsigned_long_const&>
                ((PointerGraph *)this,&local_38,&local_40,&Offset::UNKNOWN);
  local_44 = 0;
  n_00 = PointerGraph::create<(dg::pta::PSNodeType)18,dg::pta::PSNodeAlloc*&,int>
                   ((PointerGraph *)this,&local_40,&local_44);
  pPVar1 = local_40;
  local_40->is_heap = true;
  uVar2 = llvmutils::getConstantSizeValue
                    (*(Value **)(CInst + (0x20 - (ulong)(uint)(*(int *)(CInst + 0x14) << 5))));
  (pPVar1->super_PSNode).super_SubgraphNode<dg::pta::PSNode>.size = uVar2;
  PSNodesSeq::append(__return_storage_ptr__,&local_40->super_PSNode);
  PSNodesSeq::append(__return_storage_ptr__,n);
  PSNodesSeq::append(__return_storage_ptr__,n_00);
  __return_storage_ptr__->_repr = n_00;
  return __return_storage_ptr__;
}

Assistant:

LLVMPointerGraphBuilder::PSNodesSeq
LLVMPointerGraphBuilder::createRealloc(const llvm::CallInst *CInst) {
    using namespace llvm;

    PSNodesSeq ret;

    // we create new allocation node and memcpy old pointers there
    PSNode *orig_mem = getOperand(CInst->getOperand(0));
    PSNodeAlloc *reall = PSNodeAlloc::get(PS.create<PSNodeType::ALLOC>());
    reall->setIsHeap();
    reall->setUserData(const_cast<llvm::CallInst *>(CInst));

    // copy everything that is in orig_mem to reall
    PSNode *mcp =
            PS.create<PSNodeType::MEMCPY>(orig_mem, reall, Offset::UNKNOWN);
    // we need the pointer in the last node that we return
    PSNode *ptr = PS.create<PSNodeType::CONSTANT>(reall, 0);

    reall->setIsHeap();
    reall->setSize(llvmutils::getConstantSizeValue(CInst->getOperand(1)));

    ret.append(reall);
    ret.append(mcp);
    ret.append(ptr);
    ret.setRepresentant(ptr);

    return ret;
}